

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

bool __thiscall
cppcms::json::value::load(value *this,char **begin,char *end,bool full,int *line_number)

{
  char *pcVar1;
  bool bVar2;
  int err_line;
  charbuf b;
  int local_19c;
  int *local_198;
  value *local_190;
  undefined **local_188;
  char *local_180;
  char *pcStack_178;
  char *local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  locale local_150 [8];
  long local_148 [2];
  ios_base local_138 [264];
  
  pcVar1 = *begin;
  local_188 = (undefined **)std::istream::_M_extract<double>;
  local_180 = (char *)0x0;
  pcStack_178 = (char *)0x0;
  local_170 = (char *)0x0;
  uStack_168 = 0;
  local_160 = 0;
  uStack_158 = 0;
  local_198 = line_number;
  local_190 = this;
  std::locale::locale(local_150);
  local_188 = &PTR__streambuf_00113c00;
  local_180 = pcVar1;
  pcStack_178 = pcVar1;
  local_170 = end;
  std::istream::istream((istream *)local_148,(streambuf *)&local_188);
  bVar2 = anon_unknown_9::parse_stream((istream *)local_148,local_190,full,&local_19c);
  *begin = pcStack_178;
  local_148[0] = _VTT;
  *(undefined8 *)((long)local_148 + *(long *)(_VTT + -0x18)) = _vtable;
  local_148[1] = 0;
  std::ios_base::~ios_base(local_138);
  local_188 = (undefined **)std::istream::_M_extract<double>;
  std::locale::~locale(local_150);
  if (local_198 != (int *)0x0 && !bVar2) {
    *local_198 = local_19c;
  }
  return bVar2;
}

Assistant:

bool value::load(char const *&begin,char const *end,bool full,int *line_number)
	{
		int err_line;
		if(!parse_stream(begin,end,*this,full,err_line)) {
			if(line_number)
				*line_number=err_line;
			return false;
		}
		return true;

	}